

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O2

void gen_op_evsrwu(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i32 ret_00;
  uintptr_t o_1;
  uintptr_t o;
  
  l = gen_new_label_ppc64(tcg_ctx);
  l_00 = gen_new_label_ppc64(tcg_ctx);
  ret_00 = tcg_temp_local_new_i32(tcg_ctx);
  tcg_gen_andi_i32_ppc64(tcg_ctx,ret_00,arg2,0x3f);
  tcg_gen_brcondi_i32_ppc64(tcg_ctx,TCG_COND_GE,ret_00,0x20,l);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_shr_i32,(TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                    (TCGArg)(arg1 + (long)tcg_ctx),(TCGArg)(ret_00 + (long)tcg_ctx));
  tcg_gen_br(tcg_ctx,l_00);
  gen_set_label(tcg_ctx,l);
  tcg_gen_movi_i32(tcg_ctx,ret,0);
  gen_set_label(tcg_ctx,l_00);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_op_evsrwu(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    TCGv_i32 t0 = tcg_temp_local_new_i32(tcg_ctx);

    /* No error here: 6 bits are used */
    tcg_gen_andi_i32(tcg_ctx, t0, arg2, 0x3F);
    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_GE, t0, 32, l1);
    tcg_gen_shr_i32(tcg_ctx, ret, arg1, t0);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_movi_i32(tcg_ctx, ret, 0);
    gen_set_label(tcg_ctx, l2);
    tcg_temp_free_i32(tcg_ctx, t0);
}